

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontSym.cpp
# Opt level: O2

void __thiscall
TPZFrontSym<long_double>::ExtractFrontMatrix
          (TPZFrontSym<long_double> *this,TPZFMatrix<long_double> *front)

{
  longdouble lVar1;
  long lVar2;
  long *plVar3;
  long lVar4;
  longdouble *plVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long col;
  long lVar9;
  long lVar10;
  long row;
  long local_40;
  
  lVar2 = (this->super_TPZFront<long_double>).fLocal.fNElements;
  lVar6 = 0;
  lVar10 = 0;
  if (0 < lVar2) {
    lVar10 = lVar2;
  }
  for (; (lVar9 = lVar10, lVar10 != lVar6 &&
         (lVar9 = lVar6, (this->super_TPZFront<long_double>).fLocal.fStore[lVar6] == -1));
      lVar6 = lVar6 + 1) {
  }
  (*(front->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xe]
  )(front,lVar2 - lVar9);
  local_40 = 0;
  for (lVar10 = lVar9; lVar10 < lVar2; lVar10 = lVar10 + 1) {
    if ((this->super_TPZFront<long_double>).fLocal.fStore[lVar10] != -1) {
      row = lVar10 - lVar9;
      col = local_40;
      for (lVar6 = lVar10; lVar6 < lVar2; lVar6 = lVar6 + 1) {
        plVar3 = (this->super_TPZFront<long_double>).fLocal.fStore;
        lVar7 = plVar3[lVar6];
        if (lVar7 != -1) {
          lVar4 = plVar3[lVar10];
          lVar8 = lVar7;
          if (lVar7 < lVar4) {
            lVar8 = lVar4;
          }
          if (lVar4 < lVar7) {
            lVar7 = lVar4;
          }
          lVar1 = (this->super_TPZFront<long_double>).fData.fStore
                  [((lVar8 + 1) * lVar8) / 2 + lVar7];
          plVar5 = TPZFMatrix<long_double>::operator()(front,row,col);
          *plVar5 = lVar1;
          plVar5 = TPZFMatrix<long_double>::operator()(front,row,col);
          lVar1 = *plVar5;
          plVar5 = TPZFMatrix<long_double>::operator()(front,col,row);
          *plVar5 = lVar1;
        }
        col = col + 1;
      }
    }
    local_40 = local_40 + 1;
  }
  return;
}

Assistant:

void TPZFrontSym<TVar>::ExtractFrontMatrix(TPZFMatrix<TVar> &front)
{
	int64_t maxeq = this->fLocal.NElements();
	int64_t mineq = 0;
	for(mineq=0; mineq<maxeq; mineq++) if(this->fLocal[mineq] != -1) break;
	int64_t numeq = maxeq-mineq;
	front.Redim(numeq,numeq);
	int64_t ieq,jeq;
	for(ieq=mineq;ieq<maxeq;ieq++) {
		if(this->fLocal[ieq] == -1) continue;
		int64_t il = ieq-mineq;
		for(jeq=ieq;jeq<maxeq;jeq++) {
			if(this->fLocal[jeq] == -1) continue;
			int64_t jl = jeq-mineq;
			front(il,jl) = this->Element(this->fLocal[ieq],this->fLocal[jeq]);
			front(jl,il) = front(il,jl);
		}
	}
	
}